

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O1

void pixels::compareExact(uint32_t a,uint32_t b,int x,int y,char *taga,char *tagb,char *chan)

{
  long lVar1;
  size_t sVar2;
  ostream *poVar3;
  char *func;
  
  if (a != b) {
    if (chan == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3655d8);
    }
    else {
      sVar2 = strlen(chan);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,chan,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," uint at ",9);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," not equal: ",0xc);
    if (taga == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar2 = strlen(taga);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,taga,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," 0x",3);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," vs ",4);
    if (tagb == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar2 = strlen(tagb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,tagb,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," 0x",3);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    lVar1 = *(long *)poVar3;
    func = *(char **)(lVar1 + -0x18);
    *(uint *)(poVar3 + 0x18 + (long)func) = *(uint *)(poVar3 + 0x18 + (long)func) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (a != b) {
      core_test_fail("a == b",(char *)0x1fb,0x1859d4,func);
    }
  }
  return;
}

Assistant:

static inline void compareExact (
        uint32_t    a,
        uint32_t    b,
        int         x,
        int         y,
        const char* taga,
        const char* tagb,
        const char* chan)
    {
        if (a != b)
        {
            std::cout << chan << " uint at " << x << ", " << y
                      << " not equal: " << taga << " 0x" << std::hex << a
                      << std::dec << " vs " << tagb << " 0x" << std::hex << b
                      << std::dec << std::endl;
        }
        EXRCORE_TEST (a == b);
    }